

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiOutAlsa::openVirtualPort(MidiOutAlsa *this,string *portName)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  string *this_00;
  string local_40;
  undefined8 *local_20;
  AlsaMidiData *data;
  string *portName_local;
  MidiOutAlsa *this_local;
  
  local_20 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  if (*(int *)((long)local_20 + 0xc) < 0) {
    uVar1 = *local_20;
    data = (AlsaMidiData *)portName;
    portName_local = (string *)this;
    uVar3 = std::__cxx11::string::c_str();
    uVar2 = snd_seq_create_simple_port(uVar1,uVar3,0x21,0x100002);
    *(undefined4 *)((long)local_20 + 0xc) = uVar2;
    if (*(int *)((long)local_20 + 0xc) < 0) {
      this_00 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::operator=
                ((string *)this_00,"MidiOutAlsa::openVirtualPort: ALSA error creating virtual port."
                );
      std::__cxx11::string::string((string *)&local_40,(string *)this_00);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

void MidiOutAlsa :: openVirtualPort( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( data->vport < 0 ) {
    data->vport = snd_seq_create_simple_port( data->seq, portName.c_str(),
                                              SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ,
                                              SND_SEQ_PORT_TYPE_MIDI_GENERIC|SND_SEQ_PORT_TYPE_APPLICATION );

    if ( data->vport < 0 ) {
      errorString_ = "MidiOutAlsa::openVirtualPort: ALSA error creating virtual port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
    }
  }
}